

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_lshift_safe_in_place(mp_int *r,size_t bits)

{
  ulong uVar1;
  BignumInt *pBVar2;
  uint uVar3;
  byte bVar4;
  BignumInt *pBVar5;
  uint uVar6;
  ulong uVar7;
  BignumInt BVar8;
  ulong uVar9;
  
  uVar1 = r->nw;
  if (uVar1 != 0) {
    pBVar2 = r->w;
    uVar7 = 0;
    do {
      if ((long)(uVar1 - (bits >> 6)) < 0) {
        BVar8 = 0;
      }
      else {
        BVar8 = pBVar2[uVar7];
      }
      pBVar2[uVar7] = BVar8;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    pBVar2 = r->w;
    bVar4 = 0;
    do {
      uVar7 = (-1L << (bVar4 & 0x3f)) + (uVar1 - 1);
      uVar9 = 0;
      pBVar5 = pBVar2 + uVar1;
      do {
        pBVar5 = pBVar5 + -1;
        if (uVar7 < uVar1) {
          BVar8 = r->w[uVar7];
        }
        else {
          BVar8 = 0;
        }
        if ((1L << (bVar4 & 0x3f) & bits >> 6) == 0) {
          BVar8 = *pBVar5;
        }
        *pBVar5 = BVar8;
        uVar9 = uVar9 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar1 != uVar9);
      bVar4 = bVar4 + 1;
    } while (uVar1 >> (bVar4 & 0x3f) != 0);
  }
  if (uVar1 != 0) {
    uVar6 = (uint)bits & 0x3f;
    uVar3 = 0x40 - uVar6;
    uVar9 = (ulong)(uVar3 >> 6) - 1;
    pBVar2 = r->w;
    uVar7 = uVar1 - 2;
    do {
      if (uVar7 < uVar1) {
        BVar8 = pBVar2[uVar7];
      }
      else {
        BVar8 = 0;
      }
      pBVar2[uVar7 + 1] =
           BVar8 >> ((byte)uVar3 & (byte)uVar9 & 0x3f) & uVar9 | pBVar2[uVar7 + 1] << (sbyte)uVar6;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0xfffffffffffffffe);
  }
  return;
}

Assistant:

static void mp_lshift_safe_in_place(mp_int *r, size_t bits)
{
    size_t wordshift = bits / BIGNUM_INT_BITS;
    size_t bitshift = bits % BIGNUM_INT_BITS;

    /*
     * Same strategy as mp_rshift_safe_in_place, but of course the
     * other way up.
     */

    unsigned clear = (r->nw - wordshift) >> (CHAR_BIT * sizeof(size_t) - 1);
    mp_cond_clear(r, clear);

    for (unsigned bit = 0; r->nw >> bit; bit++) {
        size_t word_offset = (size_t)1 << bit;
        BignumInt mask = -(BignumInt)((wordshift >> bit) & 1);
        for (size_t i = r->nw; i-- > 0 ;) {
            BignumInt w = mp_word(r, i - word_offset);
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }

    size_t downshift = BIGNUM_INT_BITS - bitshift;
    size_t no_shift = (downshift >> BIGNUM_INT_BITS_BITS);
    downshift &= ~-(size_t)no_shift;
    BignumInt downshifted_mask = ~-(BignumInt)no_shift;

    for (size_t i = r->nw; i-- > 0 ;) {
        r->w[i] = (r->w[i] << bitshift) |
            ((mp_word(r, i-1) >> downshift) & downshifted_mask);
    }
}